

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O2

iterator __thiscall qpdf::Array::begin(Array *this)

{
  undefined8 __p;
  QPDF_Array *pQVar1;
  iterator iVar2;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pvVar3;
  undefined1 local_30 [32];
  
  pQVar1 = BaseHandle::as<QPDF_Array>(&this->super_BaseHandle);
  if (pQVar1 == (QPDF_Array *)0x0) {
    iVar2._M_current = (QPDFObjectHandle *)0x0;
  }
  else {
    if ((pQVar1->sp)._M_t.
        super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
        super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
        super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl == (Sparse *)0x0) {
      pvVar3 = &pQVar1->elements;
    }
    else {
      pvVar3 = (this->sp_elements)._M_t.
               super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
               .
               super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>
               ._M_head_impl;
      if (pvVar3 == (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)0x0) {
        getAsVector((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)(local_30 + 8),
                    this);
        std::
        make_unique<std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>>
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_30);
        __p = local_30._0_8_;
        local_30._0_8_ =
             (__uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
              )0x0;
        std::
        __uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
        ::reset((__uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                 *)&this->sp_elements,(pointer)__p);
        std::
        unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
        ::~unique_ptr((unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                       *)local_30);
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)(local_30 + 8));
        pvVar3 = (this->sp_elements)._M_t.
                 super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>
                 ._M_head_impl;
      }
    }
    iVar2._M_current =
         (pvVar3->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
         super__Vector_impl_data._M_start;
  }
  return (iterator)iVar2._M_current;
}

Assistant:

Array::iterator
Array::begin()
{
    if (auto a = as<QPDF_Array>()) {
        if (!a->sp) {
            return a->elements.begin();
        }
        if (!sp_elements) {
            sp_elements = std::make_unique<std::vector<QPDFObjectHandle>>(getAsVector());
        }
        return sp_elements->begin();
    }
    return {};
}